

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

ecs_entity_t
ecs_run_intern(ecs_world_t *world,ecs_stage_t *stage,ecs_entity_t system,EcsSystem *system_data,
              float delta_time,int32_t offset,int32_t limit,ecs_filter_t *filter,void *param,
              _Bool ran_by_app)

{
  int iVar1;
  int32_t current;
  ecs_world_t *peVar2;
  ecs_iter_action_t p_Var3;
  double dVar4;
  _Bool _Var5;
  int32_t total;
  char *pcVar6;
  ecs_query_t *query;
  float fVar7;
  ecs_time_t time_start;
  undefined7 in_stack_fffffffffffffeb8;
  char cVar8;
  ecs_time_t local_118;
  ecs_iter_t local_110;
  
  if (param == (void *)0x0) {
    param = system_data->ctx;
  }
  fVar7 = delta_time;
  if (system_data->tick_source != 0) {
    pcVar6 = (char *)ecs_get_w_entity(world,system_data->tick_source,7);
    if ((pcVar6 == (char *)0x0) || (*pcVar6 != '\x01')) {
      return 0;
    }
    fVar7 = *(float *)(pcVar6 + 4);
  }
  cVar8 = world->measure_system_time;
  if ((_Bool)cVar8 == true) {
    (*ecs_os_api.get_time_)(&local_118);
  }
  stage->system = system;
  query = system_data->query;
  stage->system_columns = (query->sig).columns;
  iVar1 = stage->defer;
  if (iVar1 == 0) {
    ecs_defer_begin((ecs_world_t *)CONCAT17(cVar8,in_stack_fffffffffffffeb8));
    query = system_data->query;
  }
  ecs_query_iter_page(&local_110,query,offset,limit);
  peVar2 = stage->world;
  local_110.world_time = (world->stats).world_time_total;
  if (param == (void *)0x0) {
    param = system_data->ctx;
  }
  p_Var3 = system_data->action;
  local_110.world = peVar2;
  local_110.system = system;
  local_110.param = param;
  local_110.delta_time = delta_time;
  local_110.delta_system_time = fVar7;
  local_110.frame_offset = offset;
  if (ran_by_app || peVar2 == world) {
    _Var5 = ecs_query_next_w_filter(&local_110,filter);
    if (_Var5) {
      do {
        (*p_Var3)(&local_110);
        _Var5 = ecs_query_next_w_filter(&local_110,filter);
      } while (_Var5);
    }
  }
  else {
    total = ecs_vector_count(world->workers);
    current = *(int32_t *)&peVar2->c_info[0].on_add;
    _Var5 = ecs_query_next_worker(&local_110,current,total);
    if (_Var5) {
      do {
        (*p_Var3)(&local_110);
        _Var5 = ecs_query_next_worker(&local_110,current,total);
      } while (_Var5);
    }
  }
  if (iVar1 == 0) {
    ecs_defer_end((ecs_world_t *)CONCAT17(cVar8,in_stack_fffffffffffffeb8));
  }
  if (cVar8 != '\0') {
    dVar4 = ecs_time_measure(&local_118);
    system_data->time_spent = (float)dVar4 + system_data->time_spent;
  }
  stage->system = 0;
  stage->system_columns = (ecs_vector_t *)0x0;
  system_data->invoke_count = system_data->invoke_count + 1;
  return local_110.interrupted_by;
}

Assistant:

ecs_entity_t ecs_run_intern(
    ecs_world_t *world,
    ecs_stage_t *stage,
    ecs_entity_t system,
    EcsSystem *system_data,
    FLECS_FLOAT delta_time,
    int32_t offset,
    int32_t limit,
    const ecs_filter_t *filter,
    void *param,
    bool ran_by_app) 
{
    if (!param) {
        param = system_data->ctx;
    }

    FLECS_FLOAT time_elapsed = delta_time;
    ecs_entity_t tick_source = system_data->tick_source;

    if (tick_source) {
        const EcsTickSource *tick = ecs_get(
            world, tick_source, EcsTickSource);

        if (tick) {
            time_elapsed = tick->time_elapsed;

            /* If timer hasn't fired we shouldn't run the system */
            if (!tick->tick) {
                return 0;
            }
        } else {
            /* If a timer has been set but the timer entity does not have the
             * EcsTimer component, don't run the system. This can be the result
             * of a single-shot timer that has fired already. Not resetting the
             * timer field of the system will ensure that the system won't be
             * ran after the timer has fired. */
            return 0;
        }
    }

    ecs_time_t time_start;
    bool measure_time = world->measure_system_time;
    if (measure_time) {
        ecs_os_get_time(&time_start);
    }

#ifndef NDEBUG
    stage->system = system;
    stage->system_columns = system_data->query->sig.columns;
#endif
    
    bool defer = false;
    if (!stage->defer) {
        ecs_defer_begin(stage->world);
        defer = true;
    }

    /* Prepare the query iterator */
    ecs_iter_t it = ecs_query_iter_page(system_data->query, offset, limit);
    it.world = stage->world;
    it.system = system;
    it.delta_time = delta_time;
    it.delta_system_time = time_elapsed;
    it.world_time = world->stats.world_time_total;
    it.frame_offset = offset;
    
    /* Set param if provided, otherwise use system context */
    if (param) {
        it.param = param;
    } else {
        it.param = system_data->ctx;
    }

    ecs_iter_action_t action = system_data->action;

    /* If no filter is provided, just iterate tables & invoke action */
    if (ran_by_app || world == stage->world) {
        while (ecs_query_next_w_filter(&it, filter)) {
            action(&it);
        }
    } else {
        ecs_thread_t *thread = (ecs_thread_t*)stage->world;
        int32_t total = ecs_vector_count(world->workers);
        int32_t current = thread->index;

        while (ecs_query_next_worker(&it, current, total)) {
            action(&it);               
        }
    }

    if (defer) {
        ecs_defer_end(stage->world);
    }

    if (measure_time) {
        system_data->time_spent += (FLECS_FLOAT)ecs_time_measure(&time_start);
    }

#ifndef NDEBUG
    stage->system = 0;
    stage->system_columns = NULL;
#endif

    system_data->invoke_count ++;

    return it.interrupted_by;
}